

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::verifyRenderResult
          (LineRenderCase *this,IterationConfig *config)

{
  ostringstream *poVar1;
  float patternSize;
  float patternSize_00;
  int y;
  TypedObjectWrapper<(glu::ObjectType)3> *pTVar2;
  RenderContext *context;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  QueryDirection QVar8;
  QueryDirection QVar9;
  QueryDirection QVar10;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  TestLog *pTVar12;
  ConstPixelBufferAccess *pCVar13;
  void *__buf;
  char *description;
  void *__buf_00;
  QueryDirection QVar14;
  QueryDirection QVar15;
  QueryDirection QVar16;
  qpTestResult testResult;
  LineRenderCase *pLVar17;
  ulong uVar18;
  char *pcVar19;
  void *pvVar20;
  QueryDirection QVar21;
  QueryDirection QVar22;
  QueryDirection queryAreaEnd;
  QueryDirection QVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  int messageLimitCounter;
  Surface viewportSurface;
  IVec2 expectedVerticalLines;
  IVec2 expectedHorizontalLines;
  ProjectedBBox projectedBBox;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  int local_384;
  Surface local_380;
  ulong local_368;
  int local_35c;
  string local_358;
  undefined1 local_338 [12];
  int local_32c;
  TextureFormat local_328;
  string local_320;
  string local_300;
  string local_2e0;
  undefined1 local_2c0 [64];
  LogImage local_280;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  ConstPixelBufferAccess local_1d8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar7 = (*((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_368 = CONCAT44(extraout_var,iVar7);
  pRVar11 = Context::getRenderTarget((this->super_BBoxRenderCase).super_TestCase.m_context);
  local_35c = pRVar11->m_numSamples;
  projectBoundingBox(&config->bbox);
  QVar21 = (config->viewportSize).m_data[0];
  QVar15 = (config->viewportSize).m_data[1];
  fVar37 = (float)(int)QVar21;
  fVar36 = (float)(int)QVar15;
  if (this->m_isWideLineCase == false) {
    fVar35 = 0.5;
  }
  else {
    fVar35 = (float)this->m_wideLineLineWidth * 0.5;
  }
  fVar32 = floorf((local_1f0 * 0.5 + 0.5) * fVar37 - fVar35);
  QVar14 = (QueryDirection)fVar32;
  fVar32 = floorf((local_1ec * 0.5 + 0.5) * fVar36 - fVar35);
  queryAreaEnd = (QueryDirection)fVar32;
  fVar32 = ceilf((local_1e4 * 0.5 + 0.5) * fVar37 + fVar35);
  QVar16 = (QueryDirection)fVar32;
  fVar35 = ceilf((local_1e0 * 0.5 + 0.5) * fVar36 + fVar35);
  QVar22 = (QueryDirection)fVar35;
  fVar35 = (config->patternPos).m_data[0];
  fVar32 = (config->patternPos).m_data[1];
  patternSize = (config->patternSize).m_data[0];
  patternSize_00 = (config->patternSize).m_data[1];
  fVar33 = ceilf((fVar35 * 0.5 + 0.5) * fVar37 + 0.5);
  fVar34 = ceilf((fVar32 * 0.5 + 0.5) * fVar36 + 0.5);
  fVar37 = floorf(((fVar35 + patternSize) * 0.5 + 0.5) * fVar37 + -0.5);
  fVar36 = floorf(((fVar32 + patternSize_00) * 0.5 + 0.5) * fVar36 + -0.5);
  getNumberOfLinesRange
            ((LineRenderCase *)(local_338 + 8),(int)this,queryAreaEnd,fVar32,patternSize_00,QVar22,
             QVar15);
  getNumberOfLinesRange
            ((LineRenderCase *)local_338,(int)this,QVar14,fVar35,patternSize,QVar16,QVar21);
  QVar8 = DIRECTION_HORIZONTAL;
  if (0 < (int)QVar14) {
    QVar8 = QVar14;
  }
  QVar23 = DIRECTION_HORIZONTAL;
  if (0 < (int)queryAreaEnd) {
    QVar23 = queryAreaEnd;
  }
  QVar9 = QVar21;
  if ((int)QVar16 < (int)QVar21) {
    QVar9 = QVar16;
  }
  QVar10 = QVar15;
  if ((int)QVar22 < (int)QVar15) {
    QVar10 = QVar22;
  }
  tcu::Surface::Surface(&local_380,QVar21,QVar15);
  local_384 = 8;
  if ((this->super_BBoxRenderCase).m_calcPerPrimitiveBBox == false) {
    local_1b0._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Projected bounding box: (clip space)\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx: [",5);
    std::ostream::_M_insert<double>((double)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)local_1e4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty: [",5);
    std::ostream::_M_insert<double>((double)local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz: [",5);
    std::ostream::_M_insert<double>((double)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)local_1dc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"In viewport coordinates:\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx: [",5);
    std::ostream::operator<<(poVar1,QVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,QVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty: [",5);
    std::ostream::operator<<(poVar1,queryAreaEnd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,QVar22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying render results within the bounding box:\n",0x32);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  else {
    local_1b0._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying render result:",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  local_1b0._0_8_ =
       ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "\tCalculating number of horizontal and vertical lines within the bounding box, expecting:\n"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t[",2);
  std::ostream::operator<<(poVar1,local_338._8_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_32c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] horizontal lines.\n",0x14)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t[",2);
  std::ostream::operator<<(poVar1,local_338._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,local_338._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] vertical lines.\n",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  pTVar2 = (this->super_BBoxRenderCase).m_fbo.
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           .m_data.ptr;
  if (pTVar2 != (TypedObjectWrapper<(glu::ObjectType)3> *)0x0) {
    (**(code **)(local_368 + 0x78))(0x8ca8,(pTVar2->super_ObjectWrapper).m_object);
  }
  context = ((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx;
  iVar7 = (config->viewportPos).m_data[0];
  y = (config->viewportPos).m_data[1];
  local_280.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar20 = (void *)local_380.m_pixels.m_cap;
  if ((void *)local_380.m_pixels.m_cap != (void *)0x0) {
    pvVar20 = local_380.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_280,local_380.m_width,
             local_380.m_height,1,pvVar20);
  glu::readPixels(context,iVar7,y,(PixelBufferAccess *)local_1b0);
  QVar14 = (QueryDirection)fVar37;
  QVar16 = (QueryDirection)fVar34;
  QVar15 = (QueryDirection)fVar33;
  QVar21 = QVar16;
  if ((int)QVar16 < (int)QVar23) {
    QVar21 = QVar23;
  }
  QVar22 = (int)fVar36;
  if ((int)QVar10 < (int)fVar36) {
    QVar22 = QVar10;
  }
  if ((int)QVar21 < (int)QVar22) {
    if ((int)QVar15 < (int)QVar8) {
      QVar15 = QVar8;
    }
    if ((int)QVar9 < (int)QVar14) {
      QVar14 = QVar9;
    }
    iVar7 = 0;
    local_3bc = 0;
    local_3c4 = 0;
    local_3c8 = 0;
    local_3c0 = 0;
    local_368 = local_368 & 0xffffffff00000000;
    do {
      local_280.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar20 = (void *)local_380.m_pixels.m_cap;
      if ((void *)local_380.m_pixels.m_cap != (void *)0x0) {
        pvVar20 = local_380.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_280,local_380.m_width,
                 local_380.m_height,1,pvVar20);
      local_280.m_name._M_dataplus._M_p._4_4_ = QVar21;
      local_280.m_name._M_dataplus._M_p._0_4_ = QVar8;
      local_280.m_name._M_string_length._4_4_ = 1;
      local_280.m_name._M_string_length._0_4_ = QVar9 - QVar8;
      bVar3 = checkAreaNumLines(this,(ConstPixelBufferAccess *)local_1b0,(IVec4 *)&local_280,
                                &local_384,1,(IVec2 *)local_338);
      local_2c0._0_4_ = QVar9;
      local_2c0._4_4_ = QVar21;
      bVar4 = checkLineWidths(this,(ConstPixelBufferAccess *)local_1b0,(IVec2 *)&local_280,
                              (IVec2 *)local_2c0,1,&local_384);
      local_280.m_name._M_dataplus._M_p._0_4_ = QVar15;
      pLVar17 = this;
      local_2c0._0_4_ = QVar14;
      local_2c0._4_4_ = QVar21;
      bVar5 = checkLineContinuity(this,(ConstPixelBufferAccess *)local_1b0,(IVec2 *)&local_280,
                                  (IVec2 *)local_2c0,2,&local_384);
      if (bVar5 == 0) {
        bVar5 = 0x10;
      }
      if (bVar4 == 0) {
        bVar4 = 2;
      }
      bVar5 = bVar4 | bVar3 | bVar5;
      if ((bVar5 & 0x10) == 0) {
        if ((bVar5 & 0x40) == 0) {
          local_3c8 = local_3c8 + 1;
        }
        else {
          local_3c4 = local_3c4 + 1;
        }
      }
      else if ((bVar5 & 2) == 0) {
        if ((local_35c < 2) || (this->m_isWideLineCase == false)) {
          if ((bVar5 & 0xc) == 4) {
            local_368 = CONCAT44(local_368._4_4_,(int)local_368 + 1);
          }
          else {
            local_3c0 = local_3c0 + 1;
          }
        }
        else {
          local_3bc = local_3bc + 1;
        }
      }
      iVar7 = iVar7 + (~(uint)bVar5 & 1);
      QVar21 = QVar21 + DIRECTION_VERTICAL;
    } while (QVar22 != QVar21);
    bVar3 = local_3c0 != 0;
    bVar24 = local_3c8 != 0;
    bVar25 = local_3bc != 0;
    bVar26 = (int)local_368 != 0;
    bVar27 = local_3c4 == 0;
    uVar18 = CONCAT71((int7)((ulong)pLVar17 >> 8),iVar7 != 0);
  }
  else {
    if ((int)QVar15 < (int)QVar8) {
      QVar15 = QVar8;
    }
    if ((int)QVar9 < (int)QVar14) {
      QVar14 = QVar9;
    }
    bVar27 = true;
    bVar26 = false;
    bVar3 = false;
    bVar24 = false;
    bVar25 = false;
    uVar18 = 0;
  }
  if ((int)QVar15 < (int)QVar14) {
    local_368 = CONCAT44(local_368._4_4_,(int)uVar18);
    if ((int)QVar23 < (int)QVar16) {
      QVar16 = QVar23;
    }
    local_3b0 = 0;
    local_3b4 = 0;
    local_3c8 = 0;
    local_3c4 = 0;
    local_3b8 = 0;
    iVar7 = 0;
    do {
      local_280.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar20 = (void *)local_380.m_pixels.m_cap;
      if ((void *)local_380.m_pixels.m_cap != (void *)0x0) {
        pvVar20 = local_380.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_280,local_380.m_width,
                 local_380.m_height,1,pvVar20);
      local_280.m_name._M_dataplus._M_p._4_4_ = QVar23;
      local_280.m_name._M_dataplus._M_p._0_4_ = QVar15;
      local_280.m_name._M_string_length._0_4_ = 1;
      local_280.m_name._M_string_length._4_4_ = QVar10 - QVar23;
      bVar6 = checkAreaNumLines(this,(ConstPixelBufferAccess *)local_1b0,(IVec4 *)&local_280,
                                &local_384,2,(IVec2 *)(local_338 + 8));
      local_2c0._0_4_ = QVar15;
      local_2c0._4_4_ = QVar10;
      bVar4 = checkLineWidths(this,(ConstPixelBufferAccess *)local_1b0,(IVec2 *)&local_280,
                              (IVec2 *)local_2c0,2,&local_384);
      local_280.m_name._M_dataplus._M_p._4_4_ = QVar16;
      local_2c0._0_4_ = QVar15;
      local_2c0._4_4_ = QVar22;
      bVar5 = checkLineContinuity(this,(ConstPixelBufferAccess *)local_1b0,(IVec2 *)&local_280,
                                  (IVec2 *)local_2c0,1,&local_384);
      if (bVar5 == 0) {
        bVar5 = 0x10;
      }
      if (bVar4 == 0) {
        bVar4 = 2;
      }
      bVar5 = bVar4 | bVar6 | bVar5;
      if ((bVar5 & 0x10) == 0) {
        if ((bVar5 & 0x40) == 0) {
          local_3b4 = local_3b4 + 1;
        }
        else {
          local_3b0 = local_3b0 + 1;
        }
      }
      else if ((bVar5 & 2) == 0) {
        if ((local_35c < 2) || (this->m_isWideLineCase == false)) {
          if ((bVar5 & 0xc) == 4) {
            local_3c4 = local_3c4 + 1;
          }
          else {
            local_3c8 = local_3c8 + 1;
          }
        }
        else {
          local_3b8 = local_3b8 + 1;
        }
      }
      iVar7 = iVar7 + (~(uint)bVar5 & 1);
      QVar15 = QVar15 + DIRECTION_VERTICAL;
    } while (QVar14 != QVar15);
    bVar28 = local_3b4 != 0;
    bVar29 = local_3b8 != 0;
    bVar30 = local_3c4 != 0;
    bVar6 = iVar7 == 0;
    bVar31 = local_3b0 == 0;
    uVar18 = local_368 & 0xffffffff;
    if (local_3c8 == 0 && !bVar3) {
LAB_0164bebc:
      if (bVar28 == false && !bVar24) {
        if (bVar29 || bVar25) {
          bVar28 = false;
        }
        else {
          if (!bVar30 && !bVar26) {
            if (bVar6) {
              bVar27 = (bool)((byte)uVar18 & bVar31);
              bVar28 = (bool)((bVar31 ^ 1U) & (byte)uVar18);
            }
            else {
              bVar28 = (bool)(bVar27 ^ 1);
            }
            bVar31 = bVar27;
            if ((bVar27 == false) && (bVar28 == false)) {
              local_1b0._0_8_ =
                   ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"Result image ok.",0x10);
              pTVar12 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
              local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Images","");
              local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_358,"Image verification","");
              tcu::LogImageSet::LogImageSet((LogImageSet *)local_2c0,&local_2e0,&local_358);
              tcu::TestLog::startImageSet
                        (pTVar12,(char *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_),
                         (char *)local_2c0._32_8_);
              local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Viewport","");
              local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_320,"Viewport contents","");
              local_328.order = RGBA;
              local_328.type = UNORM_INT8;
              if ((void *)local_380.m_pixels.m_cap != (void *)0x0) {
                local_380.m_pixels.m_cap = (size_t)local_380.m_pixels.m_ptr;
              }
              tcu::PixelBufferAccess::PixelBufferAccess
                        ((PixelBufferAccess *)&local_1d8,&local_328,local_380.m_width,
                         local_380.m_height,1,(void *)local_380.m_pixels.m_cap);
              pCVar13 = &local_1d8;
              tcu::LogImage::LogImage
                        (&local_280,&local_300,&local_320,pCVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write(&local_280,(int)pTVar12,__buf_00,(size_t)pCVar13);
              tcu::TestLog::endImageSet(pTVar12);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
                operator_delete(local_280.m_description._M_dataplus._M_p,
                                local_280.m_description.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
                operator_delete(local_280.m_name._M_dataplus._M_p,
                                (ulong)(local_280.m_name.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p,
                                local_320.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p,
                                local_300.field_2._M_allocated_capacity + 1);
              }
              if ((TypedObjectWrapper<(glu::ObjectType)1> *)local_2c0._32_8_ !=
                  (TypedObjectWrapper<(glu::ObjectType)1> *)(local_2c0 + 0x30)) {
                operator_delete((void *)local_2c0._32_8_,(ulong)(local_2c0._48_8_ + 1));
              }
              if ((undefined1 *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) != local_2c0 + 0x10) {
                operator_delete((undefined1 *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_),
                                (ulong)(local_2c0._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_dataplus._M_p != &local_358.field_2) {
                operator_delete(local_358._M_dataplus._M_p,
                                local_358.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                local_2e0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              goto LAB_0164c281;
            }
            goto LAB_0164bee7;
          }
          bVar28 = true;
        }
        bVar31 = false;
        goto LAB_0164bee7;
      }
    }
    bVar28 = false;
    bVar31 = true;
  }
  else {
    bVar31 = true;
    bVar28 = false;
    bVar30 = false;
    bVar29 = false;
    bVar6 = true;
    if (!bVar3) goto LAB_0164bebc;
  }
LAB_0164bee7:
  iVar7 = local_384;
  if (local_384 < 0) {
    local_1b0._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
    std::ostream::operator<<(poVar1,-iVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," row/column error descriptions.",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  local_1b0._0_8_ =
       ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),"Image verification failed.",0x1a);
  pTVar12 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Images","");
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Image verification","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)local_2c0,&local_2e0,&local_358);
  tcu::TestLog::startImageSet
            (pTVar12,(char *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_),(char *)local_2c0._32_8_);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Viewport","");
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Viewport contents","");
  local_328.order = RGBA;
  local_328.type = UNORM_INT8;
  if ((void *)local_380.m_pixels.m_cap != (void *)0x0) {
    local_380.m_pixels.m_cap = (size_t)local_380.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_1d8,&local_328,local_380.m_width,local_380.m_height,1,
             (void *)local_380.m_pixels.m_cap);
  pCVar13 = &local_1d8;
  tcu::LogImage::LogImage(&local_280,&local_300,&local_320,pCVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_280,(int)pTVar12,__buf,(size_t)pCVar13);
  tcu::TestLog::endImageSet(pTVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
    operator_delete(local_280.m_description._M_dataplus._M_p,
                    local_280.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
    operator_delete(local_280.m_name._M_dataplus._M_p,
                    (ulong)(local_280.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((TypedObjectWrapper<(glu::ObjectType)1> *)local_2c0._32_8_ !=
      (TypedObjectWrapper<(glu::ObjectType)1> *)(local_2c0 + 0x30)) {
    operator_delete((void *)local_2c0._32_8_,(ulong)(local_2c0._48_8_ + 1));
  }
  if ((undefined1 *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) != local_2c0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_),
                    (ulong)(local_2c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  pcVar19 = "Multisampled wide line verification failed";
  if (bVar28 != false) {
    pcVar19 = "Line width verification failed";
  }
  testResult = QP_TEST_RESULT_FAIL;
  if (bVar31 == false) {
    testResult = bVar28 ^ QP_TEST_RESULT_COMPATIBILITY_WARNING;
  }
  description = "Image verification failed";
  if (bVar31 == false) {
    description = pcVar19;
  }
  tcu::TestContext::setTestResult
            ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             testResult,description);
LAB_0164c281:
  tcu::Surface::~Surface(&local_380);
  return;
}

Assistant:

void LineRenderCase::verifyRenderResult (const IterationConfig& config)
{
	const glw::Functions&	gl							= m_context.getRenderContext().getFunctions();
	const bool				isMsaa						= m_context.getRenderTarget().getNumSamples() > 1;
	const ProjectedBBox		projectedBBox				= projectBoundingBox(config.bbox);
	const float				lineWidth					= (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f);
	const tcu::IVec4		viewportBBoxArea			= getViewportBoundingBoxArea(projectedBBox, config.viewportSize, lineWidth);
	const tcu::IVec4		viewportPatternArea			= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_INWARDS);
	const tcu::IVec2		expectedHorizontalLines		= getNumberOfLinesRange(viewportBBoxArea.y(), viewportBBoxArea.w(), config.patternPos.y(), config.patternSize.y(), config.viewportSize.y(), DIRECTION_VERTICAL);
	const tcu::IVec2		expectedVerticalLines		= getNumberOfLinesRange(viewportBBoxArea.x(), viewportBBoxArea.z(), config.patternPos.x(), config.patternSize.x(), config.viewportSize.x(), DIRECTION_HORIZONTAL);
	const tcu::IVec4		verificationArea			= tcu::IVec4(de::max(viewportBBoxArea.x(), 0),
																	 de::max(viewportBBoxArea.y(), 0),
																	 de::min(viewportBBoxArea.z(), config.viewportSize.x()),
																	 de::min(viewportBBoxArea.w(), config.viewportSize.y()));

	tcu::Surface			viewportSurface				(config.viewportSize.x(), config.viewportSize.y());
	int						messageLimitCounter			= 8;

	enum ScanResultCodes
	{
		SCANRESULT_NUM_LINES_ERR	= 0,
		SCANRESULT_LINE_WIDTH_MSAA	= 1,
		SCANRESULT_LINE_WIDTH_WARN	= 2,
		SCANRESULT_LINE_WIDTH_ERR	= 3,
		SCANRESULT_LINE_CONT_ERR	= 4,
		SCANRESULT_LINE_CONT_WARN	= 5,
		SCANRESULT_LINE_LAST
	};

	int						rowScanResult[SCANRESULT_LINE_LAST]		= {0, 0, 0, 0, 0, 0};
	int						columnScanResult[SCANRESULT_LINE_LAST]	= {0, 0, 0, 0, 0, 0};
	bool					anyError								= false;
	bool					msaaRelaxationRequired					= false;
	bool					hwIssueRelaxationRequired				= false;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Projected bounding box: (clip space)\n"
				<< "\tx: [" << projectedBBox.min.x() << "," << projectedBBox.max.x() << "]\n"
				<< "\ty: [" << projectedBBox.min.y() << "," << projectedBBox.max.y() << "]\n"
				<< "\tz: [" << projectedBBox.min.z() << "," << projectedBBox.max.z() << "]\n"
			<< "In viewport coordinates:\n"
				<< "\tx: [" << viewportBBoxArea.x() << ", " << viewportBBoxArea.z() << "]\n"
				<< "\ty: [" << viewportBBoxArea.y() << ", " << viewportBBoxArea.w() << "]\n"
			<< "Verifying render results within the bounding box:\n"
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying render result:"
			<< tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
			<< "\tCalculating number of horizontal and vertical lines within the bounding box, expecting:\n"
			<< "\t[" << expectedHorizontalLines.x() << ", " << expectedHorizontalLines.y() << "] horizontal lines.\n"
			<< "\t[" << expectedVerticalLines.x() << ", " << expectedVerticalLines.y() << "] vertical lines.\n"
		<< tcu::TestLog::EndMessage;

	if (m_fbo)
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	glu::readPixels(m_context.getRenderContext(), config.viewportPos.x(), config.viewportPos.y(), viewportSurface.getAccess());

	// scan rows
	for (int y = de::max(verificationArea.y(), viewportPatternArea.y()); y < de::min(verificationArea.w(), viewportPatternArea.w()); ++y)
	{
		const deUint8 result = scanRow(viewportSurface.getAccess(),
									   y,
									   verificationArea.x(),
									   verificationArea.z(),
									   de::max(verificationArea.x(), viewportPatternArea.x()),
									   de::min(verificationArea.z(), viewportPatternArea.z()),
									   expectedVerticalLines,
									   messageLimitCounter);

		if ((result & SCANRESULT_NUM_LINES_OK_BIT) == 0)
			rowScanResult[SCANRESULT_NUM_LINES_ERR]++;
		if ((result & SCANRESULT_LINE_CONT_OK_BIT) == 0)
		{
			if ((result & SCANRESULT_LINE_CONT_WARN_BIT) != 0)
				rowScanResult[SCANRESULT_LINE_CONT_WARN]++;
			else
				rowScanResult[SCANRESULT_LINE_CONT_ERR]++;
		}
		else if ((result & SCANRESULT_LINE_WIDTH_OK_BIT) == 0)
		{
			if (m_isWideLineCase && isMsaa)
			{
				// multisampled wide lines might not be supported
				rowScanResult[SCANRESULT_LINE_WIDTH_MSAA]++;
			}
			else if ((result & SCANRESULT_LINE_WIDTH_ERR_BIT) == 0 &&
					 (result & SCANRESULT_LINE_WIDTH_WARN_BIT) != 0)
			{
				rowScanResult[SCANRESULT_LINE_WIDTH_WARN]++;
			}
			else
				rowScanResult[SCANRESULT_LINE_WIDTH_ERR]++;
		}
	}

	// scan columns
	for (int x = de::max(verificationArea.x(), viewportPatternArea.x()); x < de::min(verificationArea.z(), viewportPatternArea.z()); ++x)
	{
		const deUint8 result = scanColumn(viewportSurface.getAccess(),
										  x,
										  verificationArea.y(),
										  verificationArea.w(),
										  de::min(verificationArea.y(), viewportPatternArea.y()),
										  de::min(verificationArea.w(), viewportPatternArea.w()),
										  expectedHorizontalLines,
										  messageLimitCounter);

		if ((result & SCANRESULT_NUM_LINES_OK_BIT) == 0)
			columnScanResult[SCANRESULT_NUM_LINES_ERR]++;
		if ((result & SCANRESULT_LINE_CONT_OK_BIT) == 0)
		{
			if ((result & SCANRESULT_LINE_CONT_WARN_BIT) != 0)
				columnScanResult[SCANRESULT_LINE_CONT_WARN]++;
			else
				columnScanResult[SCANRESULT_LINE_CONT_ERR]++;
		}
		else if ((result & SCANRESULT_LINE_WIDTH_OK_BIT) == 0)
		{
			if (m_isWideLineCase && isMsaa)
			{
				// multisampled wide lines might not be supported
				columnScanResult[SCANRESULT_LINE_WIDTH_MSAA]++;
			}
			else if ((result & SCANRESULT_LINE_WIDTH_ERR_BIT) == 0 &&
					 (result & SCANRESULT_LINE_WIDTH_WARN_BIT) != 0)
			{
				columnScanResult[SCANRESULT_LINE_WIDTH_WARN]++;
			}
			else
				columnScanResult[SCANRESULT_LINE_WIDTH_ERR]++;
		}
	}

	if (columnScanResult[SCANRESULT_LINE_WIDTH_ERR] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_ERR] != 0)
		anyError = true;
	else if(columnScanResult[SCANRESULT_LINE_CONT_ERR] != 0 || rowScanResult[SCANRESULT_LINE_CONT_ERR] != 0)
		anyError = true;
	else if (columnScanResult[SCANRESULT_LINE_WIDTH_MSAA] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_MSAA] != 0)
		msaaRelaxationRequired = true;
	else if (columnScanResult[SCANRESULT_LINE_WIDTH_WARN] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_WARN] != 0)
		hwIssueRelaxationRequired = true;
	else if (columnScanResult[SCANRESULT_NUM_LINES_ERR] != 0)
	{
		// found missing lines in a columnw and row line continuity check reported a warning (not an error) -> line width precision issue
		if (rowScanResult[SCANRESULT_LINE_CONT_ERR] == 0 && rowScanResult[SCANRESULT_LINE_CONT_WARN])
			hwIssueRelaxationRequired = true;
		else
			anyError = true;
	}
	else if (rowScanResult[SCANRESULT_NUM_LINES_ERR] != 0)
	{
		// found missing lines in a row and column line continuity check reported a warning (not an error) -> line width precision issue
		if (columnScanResult[SCANRESULT_LINE_CONT_ERR] == 0 && columnScanResult[SCANRESULT_LINE_CONT_WARN])
			hwIssueRelaxationRequired = true;
		else
			anyError = true;
	}

	if (anyError || msaaRelaxationRequired || hwIssueRelaxationRequired)
	{
		if (messageLimitCounter < 0)
			m_testCtx.getLog() << tcu::TestLog::Message << "Omitted " << (-messageLimitCounter) << " row/column error descriptions." << tcu::TestLog::EndMessage;

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;

		if (anyError)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
		else if (hwIssueRelaxationRequired)
		{
			// Line width hw issue
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Line width verification failed");
		}
		else
		{
			// MSAA wide lines are optional
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Multisampled wide line verification failed");
		}
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result image ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
}